

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O1

BigNumber * operator-(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2)

{
  uint *__args;
  uint uVar1;
  bool bVar2;
  pointer puVar3;
  uint uVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  iterator iVar11;
  int iVar12;
  long lVar13;
  undefined8 local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BigNumber::BigNumber(__return_storage_ptr__,&local_48,nb2->m_base);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bVar2 = operator>(nb1,nb2);
  if (bVar2) {
    puVar5 = (nb1->super_Polynome).m_coef.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(nb1->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar5;
    uVar7 = (long)uVar6 >> 2;
    puVar3 = (nb2->super_Polynome).m_coef.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(nb2->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3;
    uVar10 = (long)uVar9 >> 2;
    if ((long)(uVar6 | uVar9) >> 2 != 0) {
      uVar6 = 0;
      uVar8 = 1;
      lVar13 = 0;
      do {
        iVar12 = (int)lVar13;
        if ((uVar6 < uVar7) && (uVar6 < uVar10)) {
          uVar4 = puVar5[uVar6];
          uVar1 = puVar3[uVar6];
          if (uVar4 < uVar1) {
            local_50 = nb1->m_base - (lVar13 + (ulong)puVar3[uVar6]);
            iVar11._M_current =
                 (__return_storage_ptr__->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (__return_storage_ptr__->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_long>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,iVar11,&local_50);
            }
            else {
              *iVar11._M_current = (uint)local_50;
              (__return_storage_ptr__->super_Polynome).m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar11._M_current + 1;
            }
            puVar5 = (__return_storage_ptr__->super_Polynome).m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar6;
            *puVar5 = *puVar5 + (nb1->super_Polynome).m_coef.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar6];
          }
          else {
            if ((iVar12 == 0) || (nb2->m_base - (ulong)uVar1 != 1)) {
              if (uVar4 == uVar1) {
                if (uVar4 == 0) {
                  local_50 = (ulong)local_50._4_4_ << 0x20;
                  iVar11._M_current =
                       (__return_storage_ptr__->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar11._M_current !=
                      (__return_storage_ptr__->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    *iVar11._M_current = 0;
                    goto LAB_001039c3;
                  }
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             __return_storage_ptr__,iVar11,(int *)&local_50);
                }
                else {
                  local_50 = (nb1->m_base - 1) * lVar13;
                  iVar11._M_current =
                       (__return_storage_ptr__->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar11._M_current ==
                      (__return_storage_ptr__->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_long>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               __return_storage_ptr__,iVar11,&local_50);
                  }
                  else {
                    *iVar11._M_current = (uint)local_50;
LAB_001039c3:
                    (__return_storage_ptr__->super_Polynome).m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar11._M_current + 1;
                  }
                }
                goto LAB_001039ff;
              }
              uVar4 = puVar5[uVar6] - (iVar12 + puVar3[uVar6]);
              local_50 = CONCAT44(local_50._4_4_,uVar4);
              iVar11._M_current =
                   (__return_storage_ptr__->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar11._M_current !=
                  (__return_storage_ptr__->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar11._M_current = uVar4;
                goto LAB_00103968;
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,iVar11,(uint *)&local_50);
              goto LAB_00103970;
            }
            iVar11._M_current =
                 (__return_storage_ptr__->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (__return_storage_ptr__->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              lVar13 = 1;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__
                         ,iVar11,puVar5 + uVar6);
              goto LAB_001039ff;
            }
            *iVar11._M_current = uVar4;
LAB_00103990:
            (__return_storage_ptr__->super_Polynome).m_coef.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
LAB_001039f9:
          lVar13 = 1;
        }
        else if (uVar6 < uVar7) {
          __args = puVar5 + uVar6;
          if (iVar12 == 0) {
            iVar11._M_current =
                 (__return_storage_ptr__->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (__return_storage_ptr__->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              lVar13 = 0;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__
                         ,iVar11,__args);
              goto LAB_001039ff;
            }
            uVar4 = *__args;
          }
          else {
            if (*__args == 0) {
              local_50 = nb1->m_base - 1;
              iVar11._M_current =
                   (__return_storage_ptr__->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar11._M_current !=
                  (__return_storage_ptr__->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar11._M_current = (uint)local_50;
                goto LAB_00103990;
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_long>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,iVar11,&local_50);
              goto LAB_001039f9;
            }
            uVar4 = *__args - 1;
            local_50 = CONCAT44(local_50._4_4_,uVar4);
            iVar11._M_current =
                 (__return_storage_ptr__->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (__return_storage_ptr__->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,iVar11,(uint *)&local_50);
              goto LAB_00103970;
            }
          }
          *iVar11._M_current = uVar4;
LAB_00103968:
          (__return_storage_ptr__->super_Polynome).m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
LAB_00103970:
          lVar13 = 0;
        }
LAB_001039ff:
        puVar5 = (nb1->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (long)(nb1->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
        puVar3 = (nb2->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (long)(nb2->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
        uVar9 = uVar10;
        if (uVar10 < uVar7) {
          uVar9 = uVar7;
        }
        uVar6 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar6 < uVar9);
    }
    BigNumber::m_format(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator - (BigNumber nb1, BigNumber nb2) {
    /*
     * TODO : A refaire ^^
     */
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    BigNumber tmp ({}, nb2.m_base);
    int retenue = 0;
    if(nb1 > nb2) {
        for (unsigned int i = 0; i < max(nb1.m_coef.size(), nb2.m_coef.size()); i++) {
            if (i < nb1.m_coef.size() && i < nb2.m_coef.size()) {
                if (nb1.m_coef[i] >= nb2.m_coef[i]) {
                    if (retenue && nb2.m_base - nb2.m_coef[i] == 1) {
                        tmp.m_coef.emplace_back(nb1.m_coef[i]);
                        retenue = 1;
                    } else {
                        if (nb1.m_coef[i] != nb2.m_coef[i]) {
                            tmp.m_coef.emplace_back(nb1.m_coef[i] - nb2.m_coef[i] - retenue);
                            retenue = 0;
                        } else if (nb1.m_coef[i] == 0) {
                            tmp.m_coef.emplace_back(0);
                        } else {
                            tmp.m_coef.emplace_back(nb1.m_base * retenue - retenue);
                        }

                    }

                } else {
                    tmp.m_coef.emplace_back(nb1.m_base - nb2.m_coef[i] - retenue);
                    tmp.m_coef[i] += nb1.m_coef[i];
                    retenue = 1;
                }
            } else if (i < nb1.m_coef.size()) {
                if (retenue == 0) {
                    tmp.m_coef.emplace_back(nb1.m_coef[i]);
                } else {
                    if (nb1.m_coef[i] == 0) {
                        tmp.m_coef.emplace_back(nb1.m_base - 1);
                    } else {
                        tmp.m_coef.emplace_back(nb1.m_coef[i] - 1);
                        retenue = 0;
                    }
                }

            }
        }
        tmp.m_format();
    }


//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Soustraction : " << t_tmp << endl;
    return tmp;
}